

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall deqp::gls::LifetimeTests::details::ES2Types::ES2Types(ES2Types *this,Context *ctx)

{
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  *this_00;
  vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  *this_01;
  vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  *this_02;
  ProgramType *containerType;
  TextureFboAttacher *attacher;
  RboFboAttacher *attacher_00;
  ShaderProgramAttacher *attacher_01;
  Type *types [6];
  Attacher *local_b8;
  Type *local_b0;
  Type *local_a8;
  Type *local_a0;
  Type *local_98;
  Attacher *local_90;
  Attacher *local_88;
  Attacher *local_80;
  Attacher *local_78;
  Type *local_70;
  Type *local_68;
  Type *local_60;
  Type *local_58;
  Type *local_50;
  Type *local_48;
  ProgramType *local_40;
  Type *local_38;
  
  Types::Types(&this->super_Types,ctx);
  (this->super_Types)._vptr_Types = (_func_int **)&PTR_getProgramType_01e296b8;
  SimpleBinder::SimpleBinder(&this->m_bufferBind,ctx,0x155a0fc,0,0x8892,true);
  details::Type::Type(&(this->m_bufferType).super_Type,ctx);
  (this->m_bufferType).super_Type._vptr_Type = (_func_int **)&PTR__Type_01e75500;
  (this->m_bufferType).m_getName = "buffer";
  (this->m_bufferType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenBuffers;
  *(undefined8 *)&(this->m_bufferType).field_0x40 = 0;
  (this->m_bufferType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteBuffers;
  *(undefined8 *)&(this->m_bufferType).field_0x50 = 0;
  (this->m_bufferType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsBuffer;
  *(undefined8 *)&(this->m_bufferType).field_0x60 = 0;
  (this->m_bufferType).m_binder = &(this->m_bufferBind).super_Binder;
  (this->m_bufferType).m_genCreates = false;
  SimpleBinder::SimpleBinder(&this->m_textureBind,ctx,0x155af9a,0,0xde1,true);
  local_98 = &(this->m_textureType).super_Type;
  details::Type::Type(local_98,ctx);
  (this->m_textureType).super_Type._vptr_Type = (_func_int **)&PTR__Type_01e75500;
  (this->m_textureType).m_getName = "texture";
  (this->m_textureType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenTextures;
  *(undefined8 *)&(this->m_textureType).field_0x40 = 0;
  (this->m_textureType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteTextures;
  *(undefined8 *)&(this->m_textureType).field_0x50 = 0;
  (this->m_textureType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsTexture;
  *(undefined8 *)&(this->m_textureType).field_0x60 = 0;
  (this->m_textureType).m_binder = &(this->m_textureBind).super_Binder;
  (this->m_textureType).m_genCreates = false;
  SimpleBinder::SimpleBinder(&this->m_rboBind,ctx,0x155ad34,0,0x8d41,true);
  local_a0 = &(this->m_rboType).super_Type;
  details::Type::Type(local_a0,ctx);
  (this->m_rboType).super_Type._vptr_Type = (_func_int **)&PTR__Type_01e75500;
  (this->m_rboType).m_getName = "renderbuffer";
  (this->m_rboType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenRenderbuffers;
  *(undefined8 *)&(this->m_rboType).field_0x40 = 0;
  (this->m_rboType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteRenderbuffers;
  *(undefined8 *)&(this->m_rboType).field_0x50 = 0;
  (this->m_rboType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsRenderbuffer;
  *(undefined8 *)&(this->m_rboType).field_0x60 = 0;
  (this->m_rboType).m_binder = &(this->m_rboBind).super_Binder;
  (this->m_rboType).m_genCreates = false;
  SimpleBinder::SimpleBinder(&this->m_fboBind,ctx,0x155a840,0,0x8d40,true);
  local_b0 = &(this->m_fboType).super_Type;
  details::Type::Type(local_b0,ctx);
  (this->m_fboType).super_Type._vptr_Type = (_func_int **)&PTR__Type_01e75500;
  (this->m_fboType).m_getName = "framebuffer";
  (this->m_fboType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenFramebuffers;
  *(undefined8 *)&(this->m_fboType).field_0x40 = 0;
  (this->m_fboType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteFramebuffers;
  *(undefined8 *)&(this->m_fboType).field_0x50 = 0;
  (this->m_fboType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsFramebuffer;
  *(undefined8 *)&(this->m_fboType).field_0x60 = 0;
  (this->m_fboType).m_binder = &(this->m_fboBind).super_Binder;
  (this->m_fboType).m_genCreates = false;
  local_a8 = &(this->m_shaderType).super_Type;
  ShaderType::ShaderType((ShaderType *)local_a8,ctx);
  containerType = &this->m_programType;
  local_70 = &(this->m_bufferType).super_Type;
  ProgramType::ProgramType(containerType,ctx);
  attacher = &this->m_texFboAtt;
  TextureFboAttacher::TextureFboAttacher(attacher,ctx,local_98,local_b0);
  FboInputAttacher::FboInputAttacher(&this->m_texFboInAtt,&attacher->super_FboAttacher);
  local_78 = (Attacher *)&this->m_texFboInAtt;
  FboOutputAttacher::FboOutputAttacher(&this->m_texFboOutAtt,&attacher->super_FboAttacher);
  attacher_00 = &this->m_rboFboAtt;
  RboFboAttacher::RboFboAttacher(attacher_00,ctx,local_a0,local_b0);
  local_80 = (Attacher *)&this->m_rboFboInAtt;
  FboInputAttacher::FboInputAttacher((FboInputAttacher *)local_80,&attacher_00->super_FboAttacher);
  local_90 = (Attacher *)&this->m_rboFboOutAtt;
  local_88 = (Attacher *)&this->m_texFboOutAtt;
  FboOutputAttacher::FboOutputAttacher
            ((FboOutputAttacher *)local_90,&attacher_00->super_FboAttacher);
  attacher_01 = &this->m_shaderAtt;
  ShaderProgramAttacher::ShaderProgramAttacher(attacher_01,ctx,local_a8,&containerType->super_Type);
  ShaderProgramInputAttacher::ShaderProgramInputAttacher
            (&this->m_shaderInAtt,&attacher_01->super_Attacher);
  local_68 = local_70;
  local_60 = local_98;
  local_58 = local_a0;
  local_50 = local_b0;
  local_48 = local_a8;
  local_40 = containerType;
  std::
  vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
  ::insert<deqp::gls::LifetimeTests::details::Type*const*,void>
            ((vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
              *)&(this->super_Types).m_types,
             (const_iterator)
             (this->super_Types).m_types.
             super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_68,&local_38);
  this_00 = &(this->super_Types).m_attachers;
  local_b8 = (Attacher *)attacher;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
            ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
              *)this_00,&local_b8);
  local_b8 = (Attacher *)attacher_00;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
            ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
              *)this_00,&local_b8);
  local_b8 = &attacher_01->super_Attacher;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
            ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
              *)this_00,&local_b8);
  this_01 = &(this->super_Types).m_inAttachers;
  local_b8 = local_78;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
              *)this_01,(InputAttacher **)&local_b8);
  local_b8 = local_80;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
              *)this_01,(InputAttacher **)&local_b8);
  local_b8 = (Attacher *)&this->m_shaderInAtt;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
              *)this_01,(InputAttacher **)&local_b8);
  this_02 = &(this->super_Types).m_outAttachers;
  local_b8 = local_88;
  std::
  vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::OutputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
              *)this_02,(OutputAttacher **)&local_b8);
  local_b8 = local_90;
  std::
  vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::OutputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
              *)this_02,(OutputAttacher **)&local_b8);
  return;
}

Assistant:

ES2Types::ES2Types (const Context& ctx)
	: Types			(ctx)
	, m_bufferBind	(ctx, &CallLogWrapper::glBindBuffer,
					 GL_ARRAY_BUFFER, GL_ARRAY_BUFFER_BINDING)
	, m_bufferType	(ctx, "buffer", &CallLogWrapper::glGenBuffers,
					 &CallLogWrapper::glDeleteBuffers,
					 &CallLogWrapper::glIsBuffer, &m_bufferBind)
	, m_textureBind	(ctx, &CallLogWrapper::glBindTexture, GL_TEXTURE_2D, GL_TEXTURE_BINDING_2D)
	, m_textureType	(ctx, "texture", &CallLogWrapper::glGenTextures,
					 &CallLogWrapper::glDeleteTextures,
					 &CallLogWrapper::glIsTexture, &m_textureBind)
	, m_rboBind		(ctx, &CallLogWrapper::glBindRenderbuffer,
					 GL_RENDERBUFFER, GL_RENDERBUFFER_BINDING)
	, m_rboType		(ctx, "renderbuffer",
					 &CallLogWrapper::glGenRenderbuffers,
					 &CallLogWrapper::glDeleteRenderbuffers,
					 &CallLogWrapper::glIsRenderbuffer, &m_rboBind)
	, m_fboBind		(ctx, &CallLogWrapper::glBindFramebuffer,
					 GL_FRAMEBUFFER, GL_FRAMEBUFFER_BINDING)
	, m_fboType		(ctx, "framebuffer",
					 &CallLogWrapper::glGenFramebuffers,
					 &CallLogWrapper::glDeleteFramebuffers,
					 &CallLogWrapper::glIsFramebuffer, &m_fboBind)
	, m_shaderType	(ctx)
	, m_programType	(ctx)
	, m_texFboAtt	(ctx, m_textureType, m_fboType)
	, m_texFboInAtt	(m_texFboAtt)
	, m_texFboOutAtt(m_texFboAtt)
	, m_rboFboAtt	(ctx, m_rboType, m_fboType)
	, m_rboFboInAtt	(m_rboFboAtt)
	, m_rboFboOutAtt(m_rboFboAtt)
	, m_shaderAtt	(ctx, m_shaderType, m_programType)
	, m_shaderInAtt	(m_shaderAtt)
{
	Type* const types[] =
	{
		&m_bufferType, &m_textureType, &m_rboType, &m_fboType, &m_shaderType, &m_programType
	};
	m_types.insert(m_types.end(), DE_ARRAY_BEGIN(types), DE_ARRAY_END(types));

	m_attachers.push_back(&m_texFboAtt);
	m_attachers.push_back(&m_rboFboAtt);
	m_attachers.push_back(&m_shaderAtt);

	m_inAttachers.push_back(&m_texFboInAtt);
	m_inAttachers.push_back(&m_rboFboInAtt);
	m_inAttachers.push_back(&m_shaderInAtt);

	m_outAttachers.push_back(&m_texFboOutAtt);
	m_outAttachers.push_back(&m_rboFboOutAtt);
}